

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

char * getS(lua_State *L,void *ud,size_t *size)

{
  if (*(size_t *)((long)ud + 8) != 0) {
    *size = *(size_t *)((long)ud + 8);
    *(undefined8 *)((long)ud + 8) = 0;
    return *ud;
  }
  return (char *)0x0;
}

Assistant:

static const char*getS(lua_State*L,void*ud,size_t*size){
LoadS*ls=(LoadS*)ud;
(void)L;
if(ls->size==0)return NULL;
*size=ls->size;
ls->size=0;
return ls->s;
}